

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_io.cpp
# Opt level: O1

void lume::ParseElementIndicesToArrayAnnex<unsigned_int>
               (SPMesh *mesh,string *annexName,xml_node<char> *node,uint value,GrobSet *gs)

{
  Mesh *mesh_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  index_t ind;
  char *pcVar1;
  value_type_conflict3 *pvVar2;
  LumeError *this_00;
  size_type sVar3;
  long lVar4;
  char *__s;
  initializer_list<lume::grob_t> __l;
  GrobIndex ig;
  TotalToGrobIndexMap indMap;
  ArrayAnnexTable<lume::ArrayAnnex<unsigned_int>_> annexTable;
  allocator_type local_111;
  GrobIndex local_110;
  undefined8 uStack_108;
  SPMesh local_100;
  TotalToGrobIndexMap local_f0;
  ArrayAnnexTable<lume::ArrayAnnex<unsigned_int>_> local_c0;
  
  if (node == (xml_node<char> *)0x0) {
    return;
  }
  if (3 < *(uint *)(impl::GROB_SET_DESCS + (ulong)(gs->m_offset + 1) * 4)) {
    this_00 = (LumeError *)__cxa_allocate_exception(0x30);
    LumeError::LumeError(this_00,"UGXGrobTypeArrayFromGrobSet: Unsupported grob set dimension");
    __cxa_throw(this_00,&LumeError::typeinfo,LumeError::~LumeError);
  }
  mesh_00 = (mesh->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  switch(*(uint *)(impl::GROB_SET_DESCS + (ulong)(gs->m_offset + 1) * 4)) {
  case 0:
    local_110 = (GrobIndex)((ulong)local_110.index << 0x20);
    break;
  case 1:
    local_110.grobType = EDGE;
    break;
  case 2:
    local_110.grobType = TRI;
    local_110.index = 3;
    sVar3 = 2;
    goto LAB_0019e3a5;
  case 3:
    local_110.grobType = TET;
    local_110.index = 5;
    uStack_108 = 0x600000007;
    sVar3 = 4;
    goto LAB_0019e3a5;
  }
  sVar3 = 1;
LAB_0019e3a5:
  __l._M_array = &local_110;
  __l._M_len = sVar3;
  std::vector<lume::grob_t,_std::allocator<lume::grob_t>_>::vector
            ((vector<lume::grob_t,_std::allocator<lume::grob_t>_> *)&local_c0,__l,&local_111);
  TotalToGrobIndexMap::TotalToGrobIndexMap
            (&local_f0,mesh_00,(vector<lume::grob_t,_std::allocator<lume::grob_t>_> *)&local_c0);
  if (local_c0.m_annexTable.m_mesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    operator_delete(local_c0.m_annexTable.m_mesh.
                    super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (long)local_c0.m_annexTable.m_annexes[0].
                          super___shared_ptr<lume::ArrayAnnex<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr -
                    (long)local_c0.m_annexTable.m_mesh.
                          super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  local_100.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mesh->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_100.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mesh->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_100.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_100.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_100.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_100.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_100.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ArrayAnnexTable<lume::ArrayAnnex<unsigned_int>_>::ArrayAnnexTable
            (&local_c0,&local_100,annexName,(GrobSet)gs->m_offset,true);
  if (local_100.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  ArrayAnnexTable<lume::ArrayAnnex<unsigned_int>_>::resize_annexes_to_match_grobs(&local_c0,1);
  pcVar1 = (node->super_xml_base<char>).m_value;
  __s = &rapidxml::xml_base<char>::nullstr()::zero;
  if (pcVar1 != (char *)0x0) {
    __s = pcVar1;
  }
  pcVar1 = strtok(__s," ");
  if (pcVar1 != (char *)0x0) {
    do {
      ind = atoi(pcVar1);
      local_110 = TotalToGrobIndexMap::operator()(&local_f0,ind);
      pvVar2 = ArrayAnnexTable<lume::ArrayAnnex<unsigned_int>_>::operator[](&local_c0,&local_110);
      *pvVar2 = value;
      pcVar1 = strtok((char *)0x0," ");
    } while (pcVar1 != (char *)0x0);
  }
  lVar4 = 0x88;
  do {
    this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&(((AnnexTable<lume::ArrayAnnex<unsigned_int>_> *)
                     (local_c0.m_annexTable.m_annexes + -1))->m_mesh).
                    super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr + lVar4);
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != 8);
  if (local_c0.m_annexTable.m_mesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.m_annexTable.m_mesh.
               super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_f0.m_grobTypes.super__Vector_base<lume::grob_t,_std::allocator<lume::grob_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.m_grobTypes.
                    super__Vector_base<lume::grob_t,_std::allocator<lume::grob_t>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.m_grobTypes.
                          super__Vector_base<lume::grob_t,_std::allocator<lume::grob_t>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.m_grobTypes.
                          super__Vector_base<lume::grob_t,_std::allocator<lume::grob_t>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f0.m_baseInds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.m_baseInds.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.m_baseInds.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.m_baseInds.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void ParseElementIndicesToArrayAnnex (SPMesh& mesh,
                                            const string& annexName,
                                            xml_node<>* node,
                                            const T value,
                                            const GrobSet& gs)
{
	if (!node) return;
	
	// indices in the node are referring to all elements of one dimension.
	// we have to map them to indices of individual grob types.
	TotalToGrobIndexMap indMap (*mesh, UGXGrobTypeArrayFromGrobSet (gs));

	ArrayAnnexTable <ArrayAnnex<T>> annexTable (mesh, annexName, gs, true);
	annexTable.resize_annexes_to_match_grobs (1);

	// parse the node values and assign indices
	char* p = strtok (node->value(), " ");
	while (p) {
		const auto ig = indMap (index_t (atoi(p)));
		annexTable [ig] = value;
		p = strtok (nullptr, " ");
	}
}